

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall cmConfigureLog::EnsureInit(cmConfigureLog *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  string_view key;
  undefined1 local_30 [8];
  string name;
  cmConfigureLog *this_local;
  
  if ((this->Opened & 1U) == 0) {
    name.field_2._8_8_ = this;
    bVar1 = std::ofstream::is_open();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!this->Stream.is_open()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmConfigureLog.cxx"
                    ,0x66,"void cmConfigureLog::EnsureInit()");
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>
              ((string *)local_30,&this->LogDir,(char (*) [24])0xfcf513);
    _Var2 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_app);
    std::ofstream::open((char *)&this->Stream,_Var2);
    this->Opened = true;
    std::operator<<(&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"\n---\n");
    key = (string_view)::cm::operator____s("events",6);
    BeginObject(this,key);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void cmConfigureLog::EnsureInit()
{
  if (this->Opened) {
    return;
  }
  assert(!this->Stream.is_open());

  std::string name = cmStrCat(this->LogDir, "/CMakeConfigureLog.yaml");
  this->Stream.open(name.c_str(), std::ios::out | std::ios::app);

  this->Opened = true;

  this->Stream << "\n---\n";
  this->BeginObject("events"_s);
}